

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::reporter::configure(reporter *this,configuration *cfg)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  undefined8 *puVar2;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> ofs;
  __shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  if ((cfg->output_file)._M_string_length == 0) {
    std::function<std::ostream&()>::operator=
              ((function<std::ostream&()> *)&this->os,(anon_class_1_0_00000001 *)&ofs);
  }
  else {
    std::make_shared<std::ofstream,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs);
    std::
    __shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_30,
                 (__shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&ofs);
    std::function<std::ostream&()>::operator=
              ((function<std::ostream&()> *)&this->os,(anon_class_16_1_ba1d68dc *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ofs.
                super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                     (&this->os);
  std::ios::exceptions((int)pbVar1 + (int)*(undefined8 *)(*(long *)pbVar1 + -0x18));
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                     (&this->os);
  if (((byte)pbVar1[*(long *)(*(long *)pbVar1 + -0x18) + 0x20] & 5) == 0) {
    (*this->_vptr_reporter[3])(this,cfg);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_stream_00223280;
  __cxa_throw(puVar2,&bad_stream::typeinfo,bad_stream::~bad_stream);
}

Assistant:

void configure(configuration& cfg) {
            if(cfg.output_file.empty()) {
                os = [&]() -> std::ostream& { return std::cout; };
            } else {
                auto ofs = std::make_shared<std::ofstream>(cfg.output_file);
                os = [ofs]() -> std::ostream& { return *ofs; };
            }
            report_stream().exceptions(std::ios::failbit);
            if(!report_stream()) throw bad_stream();
            do_configure(cfg);
        }